

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O2

void __thiscall
chrono::ChLoad<chrono::ChLoaderXYZnode>::LoadStateIncrement
          (ChLoad<chrono::ChLoaderXYZnode> *this,ChState *x,ChStateDelta *dw,ChState *x_new)

{
  long *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLoadableUVW,void>
            ((__shared_ptr<chrono::ChLoadable,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             &(this->loader).super_ChLoaderUVWatomic.super_ChLoaderUVW.loadable.
              super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*local_30 + 0x30))(local_30,0,x_new,x,0,dw);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

inline void ChLoad<Tloader>::LoadStateIncrement(const ChState& x, const ChStateDelta& dw, ChState& x_new) {
    this->loader.GetLoadable()->LoadableStateIncrement(0, x_new, x, 0, dw);
}